

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

bool __thiscall deqp::gls::DrawTestSpec::AttributeSpec::isBufferStrideAligned(AttributeSpec *this)

{
  bool bVar1;
  int local_20;
  int dataTypeSize;
  bool inputTypePacked;
  AttributeSpec *this_local;
  
  bVar1 = true;
  if (this->inputType != INPUTTYPE_UNSIGNED_INT_2_10_10_10) {
    bVar1 = this->inputType == INPUTTYPE_INT_2_10_10_10;
  }
  if (this->storage == STORAGE_BUFFER) {
    local_20 = inputTypeSize(this->inputType);
    if (bVar1) {
      local_20 = 4;
    }
    if (this->stride % local_20 != 0) {
      return false;
    }
  }
  return true;
}

Assistant:

bool DrawTestSpec::AttributeSpec::isBufferStrideAligned (void) const
{
	const bool inputTypePacked = inputType == DrawTestSpec::INPUTTYPE_UNSIGNED_INT_2_10_10_10 || inputType == DrawTestSpec::INPUTTYPE_INT_2_10_10_10;

	// Buffer alignment, offset is a multiple of underlying data type size?
	if (storage == STORAGE_BUFFER)
	{
		int dataTypeSize = gls::DrawTestSpec::inputTypeSize(inputType);
		if (inputTypePacked)
			dataTypeSize = 4;

		if (stride % dataTypeSize != 0)
			return false;
	}

	return true;
}